

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOfPdu.cpp
# Opt level: O1

void __thiscall DIS::IsPartOfPdu::IsPartOfPdu(IsPartOfPdu *this)

{
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IsPartOfPdu_001b5020;
  EntityID::EntityID(&this->_orginatingEntityID);
  EntityID::EntityID(&this->_receivingEntityID);
  Relationship::Relationship(&this->_relationship);
  Vector3Float::Vector3Float(&this->_partLocation);
  NamedLocationIdentification::NamedLocationIdentification(&this->_namedLocationID);
  EntityType::EntityType(&this->_partEntityType);
  PduSuperclass::setPduType((PduSuperclass *)this,'$');
  return;
}

Assistant:

IsPartOfPdu::IsPartOfPdu() : EntityManagementFamilyPdu(),
   _orginatingEntityID(), 
   _receivingEntityID(), 
   _relationship(), 
   _partLocation(), 
   _namedLocationID(), 
   _partEntityType()
{
    setPduType( 36 );
}